

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

bool __thiscall ON_Line::IsFartherThan(ON_Line *this,double d,ON_Line *L)

{
  double dVar1;
  bool bVar2;
  ON_Line *point;
  uint uVar3;
  double dVar4;
  double a;
  double b;
  double t;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  ON_3dVector local_78;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  
  dVar4 = (this->from).x;
  local_98 = (this->to).x;
  local_a0 = dVar4;
  if (local_98 < dVar4) {
    local_a0 = local_98;
    local_98 = dVar4;
  }
  dVar4 = (L->from).x;
  dVar1 = (L->to).x;
  if ((local_98 + d < dVar4) && (local_98 + d < dVar1)) {
    return true;
  }
  if ((dVar4 < local_a0 - d) && (dVar1 < local_a0 - d)) {
    return true;
  }
  dVar4 = (this->from).y;
  local_98 = (this->to).y;
  local_a0 = dVar4;
  if (local_98 < dVar4) {
    local_a0 = local_98;
    local_98 = dVar4;
  }
  dVar4 = (L->from).y;
  dVar1 = (L->to).y;
  if ((local_98 + d < dVar4) && (local_98 + d < dVar1)) {
    return true;
  }
  if ((dVar4 < local_a0 - d) && (dVar1 < local_a0 - d)) {
    return true;
  }
  dVar4 = (this->from).z;
  local_98 = (this->to).z;
  local_a0 = dVar4;
  if (local_98 < dVar4) {
    local_a0 = local_98;
    local_98 = dVar4;
  }
  dVar4 = (L->from).z;
  dVar1 = (L->to).z;
  if ((local_98 + d < dVar4) && (local_98 + d < dVar1)) {
    return true;
  }
  if ((dVar4 < local_a0 - d) && (dVar1 < local_a0 - d)) {
    return true;
  }
  local_88 = d;
  bVar2 = ON_Intersect(this,L,&local_a0,&local_98);
  if (!bVar2) {
    Direction(&local_58,this);
    Direction(&local_78,L);
    dVar4 = ON_3dVector::operator*(&local_58,&local_78);
    if (0.0 <= dVar4) {
      local_a0 = 0.0;
      point = this;
    }
    else {
      local_a0 = 1.0;
      point = (ON_Line *)&this->to;
    }
    ClosestPointTo(L,&point->from,&local_98);
    if (local_98 < 0.0) {
      local_98 = 0.0;
      ClosestPointTo(this,&L->from,&local_a0);
    }
  }
  PointAt((ON_3dPoint *)&local_58,this,local_a0);
  PointAt((ON_3dPoint *)&local_78,L,local_98);
  local_80 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_58,(ON_3dPoint *)&local_78);
  if (local_88 < local_80) {
    return true;
  }
  if (0.0 <= local_a0) {
    if (local_a0 <= 1.0) {
      bVar2 = false;
      goto LAB_004cd233;
    }
    local_a0 = 1.0;
  }
  else {
    local_a0 = 0.0;
  }
  bVar2 = true;
LAB_004cd233:
  if (bVar2) {
    PointAt(&local_40,this,local_a0);
    local_58.z = local_40.z;
    local_58.x = local_40.x;
    local_58.y = local_40.y;
    ClosestPointTo(L,(ON_3dPoint *)&local_58,&local_90);
    if (0.0 <= local_90) {
      if (1.0 < local_90) {
        local_90 = 1.0;
      }
    }
    else {
      local_90 = 0.0;
    }
    PointAt(&local_40,L,local_90);
    local_80 = ON_3dPoint::DistanceTo(&local_40,(ON_3dPoint *)&local_58);
  }
  uVar3 = 0;
  if ((local_98 < 0.0) || (uVar3 = 0x3ff00000, dVar4 = local_80, 1.0 < local_98)) {
    local_98 = (double)((ulong)uVar3 << 0x20);
    PointAt(&local_40,L,(double)((ulong)uVar3 << 0x20));
    local_78.z = local_40.z;
    local_78.x = local_40.x;
    local_78.y = local_40.y;
    ClosestPointTo(this,(ON_3dPoint *)&local_78,&local_90);
    if (0.0 <= local_90) {
      if (1.0 < local_90) {
        local_90 = 1.0;
      }
    }
    else {
      local_90 = 0.0;
    }
    PointAt(&local_40,this,local_90);
    dVar1 = ON_3dPoint::DistanceTo(&local_40,(ON_3dPoint *)&local_78);
    dVar4 = dVar1;
    if ((bVar2) && (dVar4 = local_80, dVar1 < local_80)) {
      dVar4 = dVar1;
    }
  }
  return local_88 < dVar4;
}

Assistant:

bool ON_Line::IsFartherThan( double d, const ON_Line& L ) const
{
  ON_3dPoint A, B;
  double a, b, t, x;
  bool bCheckA, bCheckB;

  a = from.x; if (to.x < a) {b=a; a = to.x;} else b = to.x;
  if ( b+d < L.from.x && b+d < L.to.x )
    return true;
  if ( a-d > L.from.x && a-d > L.to.x )
    return true;

  a = from.y; if (to.y < a) {b=a; a = to.y;} else b = to.y;
  if ( b+d < L.from.y && b+d < L.to.y )
    return true;
  if ( a-d > L.from.y && a-d > L.to.y )
    return true;

  a = from.z; if (to.z < a) {b=a; a = to.z;} else b = to.z;
  if ( b+d < L.from.z && b+d < L.to.z )
    return true;
  if ( a-d > L.from.z && a-d > L.to.z )
    return true;

  if ( !ON_Intersect(*this,L,&a,&b) )
  {
    // lines are parallel or anti parallel
    if ( Direction()*L.Direction() >= 0.0 )
    {
      // lines are parallel
      a = 0.0;
      L.ClosestPointTo(from,&b);
      // If ( b >= 0.0), then this->from and L(b) are a pair of closest points.
      if ( b < 0.0 )
      {
        // Otherwise L.from and this(a) are a pair of closest points.
        b = 0.0;
        ClosestPointTo(L.from,&a);
      }
    }
    else
    {
      // lines are anti parallel
      a = 1.0;
      L.ClosestPointTo(to,&b);
      // If ( b >= 0.0), then this->to and L(b) are a pair of closest points.
      if ( b < 0.0 )
      {
        // Otherwise L.to and this(a) are a pair of closest points.
        b = 0.0;
        ClosestPointTo(L.from,&a);
      }
    }
  }

  A = PointAt(a);
  B = L.PointAt(b);
  x = A.DistanceTo(B);
  if (x > d)
    return true;

  bCheckA = true;
  if ( a < 0.0) a = 0.0; else if (a > 1.0) a = 1.0; else bCheckA=false;
  if (bCheckA )
  {
    A = PointAt(a);
    L.ClosestPointTo(A,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = L.PointAt(t).DistanceTo(A);
  }

  bCheckB = true;
  if ( b < 0.0) b = 0.0; else if (b > 1.0) b = 1.0; else bCheckB=false;
  if ( bCheckB )
  {
    B = L.PointAt(b);
    ClosestPointTo(B,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    t = PointAt(t).DistanceTo(B);
    if ( bCheckA )
    {
      if ( t<x ) x = t;
    }
    else
    {
      x = t;
    }
  }
 
  return (x > d);
}